

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct64_low32_ssse3(__m128i *input,__m128i *output)

{
  longlong lVar1;
  longlong extraout_RDX;
  __m128i *cospi;
  int8_t in_R8B;
  undefined4 uVar2;
  __m128i _in0;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  __m128i alVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  __m128i __rounding;
  __m128i __rounding_00;
  __m128i __rounding_01;
  __m128i __rounding_02;
  __m128i __rounding_03;
  __m128i __rounding_04;
  __m128i local_438;
  __m128i local_428;
  __m128i local_418;
  undefined1 local_408 [16];
  __m128i local_3f8;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [4];
  undefined2 uStack_3d4;
  undefined2 uStack_3d2;
  undefined2 uStack_3d0;
  undefined2 uStack_3ce;
  undefined2 uStack_3cc;
  undefined2 uStack_3ca;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  
  local_438 = *input;
  local_418 = input[0x10];
  local_3f8 = input[8];
  _local_3d8 = input[0x18];
  auVar92 = pshuflw(ZEXT416(0x328),ZEXT416(0x328),0);
  uVar2 = auVar92._0_4_;
  auVar99._4_4_ = uVar2;
  auVar99._0_4_ = uVar2;
  auVar99._8_4_ = uVar2;
  auVar99._12_4_ = uVar2;
  auVar92 = pshuflw(ZEXT416(0x7ff8),ZEXT416(0x7ff8),0);
  auVar93._0_4_ = auVar92._0_4_;
  auVar93._4_4_ = auVar93._0_4_;
  auVar93._8_4_ = auVar93._0_4_;
  auVar93._12_4_ = auVar93._0_4_;
  auVar100 = pmulhrsw(auVar99,(undefined1  [16])input[1]);
  auVar94 = pmulhrsw(auVar93,(undefined1  [16])input[1]);
  auVar92 = pshuflw(ZEXT416(0xffffa7c0),ZEXT416(0xffffa7c0),0);
  uVar2 = auVar92._0_4_;
  auVar95._4_4_ = uVar2;
  auVar95._0_4_ = uVar2;
  auVar95._8_4_ = uVar2;
  auVar95._12_4_ = uVar2;
  auVar92 = pshuflw(ZEXT416(0x5cb8),ZEXT416(0x5cb8),0);
  auVar86._0_4_ = auVar92._0_4_;
  auVar86._4_4_ = auVar86._0_4_;
  auVar86._8_4_ = auVar86._0_4_;
  auVar86._12_4_ = auVar86._0_4_;
  auVar96 = pmulhrsw(auVar95,(undefined1  [16])input[0x1f]);
  auVar87 = pmulhrsw(auVar86,(undefined1  [16])input[0x1f]);
  auVar92 = pshuflw(ZEXT416(0x33e0),ZEXT416(0x33e0),0);
  uVar2 = auVar92._0_4_;
  auVar88._4_4_ = uVar2;
  auVar88._0_4_ = uVar2;
  auVar88._8_4_ = uVar2;
  auVar88._12_4_ = uVar2;
  auVar92 = pshuflw(ZEXT416(0x7508),ZEXT416(0x7508),0);
  auVar74._0_4_ = auVar92._0_4_;
  auVar74._4_4_ = auVar74._0_4_;
  auVar74._8_4_ = auVar74._0_4_;
  auVar74._12_4_ = auVar74._0_4_;
  auVar89 = pmulhrsw(auVar88,(undefined1  [16])input[0x11]);
  auVar75 = pmulhrsw(auVar74,(undefined1  [16])input[0x11]);
  auVar92 = pshuflw(ZEXT416(0xffffd1f0),ZEXT416(0xffffd1f0),0);
  uVar2 = auVar92._0_4_;
  auVar76._4_4_ = uVar2;
  auVar76._0_4_ = uVar2;
  auVar76._8_4_ = uVar2;
  auVar76._12_4_ = uVar2;
  auVar92 = pshuflw(ZEXT416(0x7770),ZEXT416(0x7770),0);
  auVar61._0_4_ = auVar92._0_4_;
  auVar61._4_4_ = auVar61._0_4_;
  auVar61._8_4_ = auVar61._0_4_;
  auVar61._12_4_ = auVar61._0_4_;
  auVar77 = pmulhrsw(auVar76,(undefined1  [16])input[0xf]);
  auVar62 = pmulhrsw(auVar61,(undefined1  [16])input[0xf]);
  auVar92 = pshuflw(ZEXT416(0x1c08),ZEXT416(0x1c08),0);
  uVar2 = auVar92._0_4_;
  auVar63._4_4_ = uVar2;
  auVar63._0_4_ = uVar2;
  auVar63._8_4_ = uVar2;
  auVar63._12_4_ = uVar2;
  auVar92 = pshuflw(ZEXT416(0x7ce0),ZEXT416(0x7ce0),0);
  auVar51._0_4_ = auVar92._0_4_;
  auVar51._4_4_ = auVar51._0_4_;
  auVar51._8_4_ = auVar51._0_4_;
  auVar51._12_4_ = auVar51._0_4_;
  auVar64 = pmulhrsw(auVar63,(undefined1  [16])input[9]);
  auVar52 = pmulhrsw(auVar51,(undefined1  [16])input[9]);
  auVar92 = pshuflw(ZEXT416(0xffffbb88),ZEXT416(0xffffbb88),0);
  uVar2 = auVar92._0_4_;
  auVar53._4_4_ = uVar2;
  auVar53._0_4_ = uVar2;
  auVar53._8_4_ = uVar2;
  auVar53._12_4_ = uVar2;
  auVar92 = pshuflw(ZEXT416(0x6c28),ZEXT416(0x6c28),0);
  auVar23._0_4_ = auVar92._0_4_;
  auVar23._4_4_ = auVar23._0_4_;
  auVar23._8_4_ = auVar23._0_4_;
  auVar23._12_4_ = auVar23._0_4_;
  auVar54 = pmulhrsw(auVar53,(undefined1  [16])input[0x17]);
  auVar24 = pmulhrsw(auVar23,(undefined1  [16])input[0x17]);
  auVar92 = pshuflw(ZEXT416(0x49b8),ZEXT416(0x49b8),0);
  uVar2 = auVar92._0_4_;
  auVar25._4_4_ = uVar2;
  auVar25._0_4_ = uVar2;
  auVar25._8_4_ = uVar2;
  auVar25._12_4_ = uVar2;
  auVar92 = pshuflw(ZEXT416(0x68a8),ZEXT416(0x68a8),0);
  auVar41._0_4_ = auVar92._0_4_;
  auVar41._4_4_ = auVar41._0_4_;
  auVar41._8_4_ = auVar41._0_4_;
  auVar41._12_4_ = auVar41._0_4_;
  auVar26 = pmulhrsw(auVar25,(undefined1  [16])input[0x19]);
  auVar3 = pmulhrsw(auVar41,(undefined1  [16])input[0x19]);
  auVar92 = pshuflw(ZEXT416(0xffffea20),ZEXT416(0xffffea20),0);
  uVar2 = auVar92._0_4_;
  auVar27._4_4_ = uVar2;
  auVar27._0_4_ = uVar2;
  auVar27._8_4_ = uVar2;
  auVar27._12_4_ = uVar2;
  auVar92 = pshuflw(ZEXT416(0x7e20),ZEXT416(0x7e20),0);
  uVar2 = auVar92._0_4_;
  auVar66._4_4_ = uVar2;
  auVar66._0_4_ = uVar2;
  auVar66._8_4_ = uVar2;
  auVar66._12_4_ = uVar2;
  auVar28 = pmulhrsw(auVar27,(undefined1  [16])input[7]);
  auVar4 = pmulhrsw(auVar66,(undefined1  [16])input[7]);
  auVar92 = pshuflw(ZEXT416(0xfa8),ZEXT416(0xfa8),0);
  uVar2 = auVar92._0_4_;
  auVar113._4_4_ = uVar2;
  auVar113._0_4_ = uVar2;
  auVar113._8_4_ = uVar2;
  auVar113._12_4_ = uVar2;
  auVar92 = pshuflw(ZEXT416(0x7f08),ZEXT416(0x7f08),0);
  uVar2 = auVar92._0_4_;
  auVar79._4_4_ = uVar2;
  auVar79._0_4_ = uVar2;
  auVar79._8_4_ = uVar2;
  auVar79._12_4_ = uVar2;
  auVar114 = pmulhrsw(auVar113,(undefined1  [16])input[5]);
  auVar5 = pmulhrsw(auVar79,(undefined1  [16])input[5]);
  auVar92 = pshuflw(ZEXT416(0xffffb140),ZEXT416(0xffffb140),0);
  uVar2 = auVar92._0_4_;
  auVar29._4_4_ = uVar2;
  auVar29._0_4_ = uVar2;
  auVar29._8_4_ = uVar2;
  auVar29._12_4_ = uVar2;
  auVar92 = pshuflw(ZEXT416(0x64e8),ZEXT416(0x64e8),0);
  uVar2 = auVar92._0_4_;
  auVar91._4_4_ = uVar2;
  auVar91._0_4_ = uVar2;
  auVar91._8_4_ = uVar2;
  auVar91._12_4_ = uVar2;
  auVar30 = pmulhrsw(auVar29,(undefined1  [16])input[0x1b]);
  auVar6 = pmulhrsw(auVar91,(undefined1  [16])input[0x1b]);
  auVar92 = pshuflw(ZEXT416(0x3f18),ZEXT416(0x3f18),0);
  uVar2 = auVar92._0_4_;
  auVar31._4_4_ = uVar2;
  auVar31._0_4_ = uVar2;
  auVar31._8_4_ = uVar2;
  auVar31._12_4_ = uVar2;
  auVar92 = pshuflw(ZEXT416(0x6f60),ZEXT416(0x6f60),0);
  uVar2 = auVar92._0_4_;
  auVar98._4_4_ = uVar2;
  auVar98._0_4_ = uVar2;
  auVar98._8_4_ = uVar2;
  auVar98._12_4_ = uVar2;
  auVar32 = pmulhrsw(auVar31,(undefined1  [16])input[0x15]);
  auVar7 = pmulhrsw(auVar98,(undefined1  [16])input[0x15]);
  auVar92 = pshuflw(ZEXT416(0xffffdde0),ZEXT416(0xffffdde0),0);
  uVar2 = auVar92._0_4_;
  auVar103._4_4_ = uVar2;
  auVar103._0_4_ = uVar2;
  auVar103._8_4_ = uVar2;
  auVar103._12_4_ = uVar2;
  auVar92 = pshuflw(ZEXT416(0x7b60),ZEXT416(0x7b60),0);
  uVar2 = auVar92._0_4_;
  auVar109._4_4_ = uVar2;
  auVar109._0_4_ = uVar2;
  auVar109._8_4_ = uVar2;
  auVar109._12_4_ = uVar2;
  auVar104 = pmulhrsw(auVar103,(undefined1  [16])input[0xb]);
  auVar110 = pmulhrsw(auVar109,(undefined1  [16])input[0xb]);
  auVar92 = pshuflw(ZEXT416(0x2828),ZEXT416(0x2828),0);
  uVar2 = auVar92._0_4_;
  auVar101._4_4_ = uVar2;
  auVar101._0_4_ = uVar2;
  auVar101._8_4_ = uVar2;
  auVar101._12_4_ = uVar2;
  auVar92 = pshuflw(ZEXT416(0x7988),ZEXT416(0x7988),0);
  uVar2 = auVar92._0_4_;
  auVar106._4_4_ = uVar2;
  auVar106._0_4_ = uVar2;
  auVar106._8_4_ = uVar2;
  auVar106._12_4_ = uVar2;
  auVar102 = pmulhrsw(auVar101,(undefined1  [16])input[0xd]);
  auVar8 = pmulhrsw(auVar106,(undefined1  [16])input[0xd]);
  auVar92 = pshuflw(ZEXT416(0xffffc670),ZEXT416(0xffffc670),0);
  uVar2 = auVar92._0_4_;
  auVar108._4_4_ = uVar2;
  auVar108._0_4_ = uVar2;
  auVar108._8_4_ = uVar2;
  auVar108._12_4_ = uVar2;
  auVar92 = pshuflw(ZEXT416(0x7258),ZEXT416(0x7258),0);
  uVar2 = auVar92._0_4_;
  auVar90._4_4_ = uVar2;
  auVar90._0_4_ = uVar2;
  auVar90._8_4_ = uVar2;
  auVar90._12_4_ = uVar2;
  auVar9 = pmulhrsw(auVar108,(undefined1  [16])input[0x13]);
  auVar91 = pmulhrsw(auVar90,(undefined1  [16])input[0x13]);
  auVar92 = pshuflw(ZEXT416(0x5398),ZEXT416(0x5398),0);
  uVar2 = auVar92._0_4_;
  auVar112._4_4_ = uVar2;
  auVar112._0_4_ = uVar2;
  auVar112._8_4_ = uVar2;
  auVar112._12_4_ = uVar2;
  auVar92 = pshuflw(ZEXT416(0x60f0),ZEXT416(0x60f0),0);
  uVar2 = auVar92._0_4_;
  auVar33._4_4_ = uVar2;
  auVar33._0_4_ = uVar2;
  auVar33._8_4_ = uVar2;
  auVar33._12_4_ = uVar2;
  auVar10 = pmulhrsw(auVar112,(undefined1  [16])input[0x1d]);
  auVar34 = pmulhrsw(auVar33,(undefined1  [16])input[0x1d]);
  auVar92 = pshuflw(ZEXT416(0xfffff698),ZEXT416(0xfffff698),0);
  uVar2 = auVar92._0_4_;
  auVar65._4_4_ = uVar2;
  auVar65._0_4_ = uVar2;
  auVar65._8_4_ = uVar2;
  auVar65._12_4_ = uVar2;
  auVar92 = pshuflw(ZEXT416(0x7fa8),ZEXT416(0x7fa8),0);
  uVar2 = auVar92._0_4_;
  auVar78._4_4_ = uVar2;
  auVar78._0_4_ = uVar2;
  auVar78._8_4_ = uVar2;
  auVar78._12_4_ = uVar2;
  auVar66 = pmulhrsw(auVar65,(undefined1  [16])input[3]);
  auVar79 = pmulhrsw(auVar78,(undefined1  [16])input[3]);
  auVar92 = pshuflw(ZEXT416(0x648),ZEXT416(0x648),0);
  uVar2 = auVar92._0_4_;
  auVar116._4_4_ = uVar2;
  auVar116._0_4_ = uVar2;
  auVar116._8_4_ = uVar2;
  auVar116._12_4_ = uVar2;
  auVar92 = pshuflw(ZEXT416(0x7fd8),ZEXT416(0x7fd8),0);
  uVar2 = auVar92._0_4_;
  auVar92._4_4_ = uVar2;
  auVar92._0_4_ = uVar2;
  auVar92._8_4_ = uVar2;
  auVar92._12_4_ = uVar2;
  auVar11 = pmulhrsw(auVar116,(undefined1  [16])input[2]);
  auVar92 = pmulhrsw(auVar92,(undefined1  [16])input[2]);
  auVar35 = pshuflw(ZEXT416(0xffffaa08),ZEXT416(0xffffaa08),0);
  uVar2 = auVar35._0_4_;
  auVar12._4_4_ = uVar2;
  auVar12._0_4_ = uVar2;
  auVar12._8_4_ = uVar2;
  auVar12._12_4_ = uVar2;
  auVar35 = pshuflw(ZEXT416(0x5ed8),ZEXT416(0x5ed8),0);
  uVar2 = auVar35._0_4_;
  auVar35._4_4_ = uVar2;
  auVar35._0_4_ = uVar2;
  auVar35._8_4_ = uVar2;
  auVar35._12_4_ = uVar2;
  auVar13 = pmulhrsw(auVar12,(undefined1  [16])input[0x1e]);
  auVar35 = pmulhrsw(auVar35,(undefined1  [16])input[0x1e]);
  auVar36 = pshuflw(ZEXT416(0x36b8),ZEXT416(0x36b8),0);
  uVar2 = auVar36._0_4_;
  auVar14._4_4_ = uVar2;
  auVar14._0_4_ = uVar2;
  auVar14._8_4_ = uVar2;
  auVar14._12_4_ = uVar2;
  auVar36 = pshuflw(ZEXT416(0x73b8),ZEXT416(0x73b8),0);
  uVar2 = auVar36._0_4_;
  auVar36._4_4_ = uVar2;
  auVar36._0_4_ = uVar2;
  auVar36._8_4_ = uVar2;
  auVar36._12_4_ = uVar2;
  auVar15 = pmulhrsw(auVar14,(undefined1  [16])input[0x12]);
  auVar36 = pmulhrsw(auVar36,(undefined1  [16])input[0x12]);
  auVar37 = pshuflw(ZEXT416(0xffffd4e0),ZEXT416(0xffffd4e0),0);
  uVar2 = auVar37._0_4_;
  auVar111._4_4_ = uVar2;
  auVar111._0_4_ = uVar2;
  auVar111._8_4_ = uVar2;
  auVar111._12_4_ = uVar2;
  auVar37 = pshuflw(ZEXT416(0x7888),ZEXT416(0x7888),0);
  uVar2 = auVar37._0_4_;
  auVar115._4_4_ = uVar2;
  auVar115._0_4_ = uVar2;
  auVar115._8_4_ = uVar2;
  auVar115._12_4_ = uVar2;
  auVar112 = pmulhrsw(auVar111,(undefined1  [16])input[0xe]);
  auVar116 = pmulhrsw(auVar115,(undefined1  [16])input[0xe]);
  auVar37 = pshuflw(ZEXT416(0x1f18),ZEXT416(0x1f18),0);
  uVar2 = auVar37._0_4_;
  auVar107._4_4_ = uVar2;
  auVar107._0_4_ = uVar2;
  auVar107._8_4_ = uVar2;
  auVar107._12_4_ = uVar2;
  auVar37 = pshuflw(ZEXT416(0x7c28),ZEXT416(0x7c28),0);
  uVar2 = auVar37._0_4_;
  auVar37._4_4_ = uVar2;
  auVar37._0_4_ = uVar2;
  auVar37._8_4_ = uVar2;
  auVar37._12_4_ = uVar2;
  auVar108 = pmulhrsw(auVar107,(undefined1  [16])input[10]);
  auVar37 = pmulhrsw(auVar37,(undefined1  [16])input[10]);
  auVar38 = pshuflw(ZEXT416(0xffffbe30),ZEXT416(0xffffbe30),0);
  uVar2 = auVar38._0_4_;
  auVar38._4_4_ = uVar2;
  auVar38._0_4_ = uVar2;
  auVar38._8_4_ = uVar2;
  auVar38._12_4_ = uVar2;
  auVar39 = pshuflw(ZEXT416(0x6dc8),ZEXT416(0x6dc8),0);
  uVar2 = auVar39._0_4_;
  auVar105._4_4_ = uVar2;
  auVar105._0_4_ = uVar2;
  auVar105._8_4_ = uVar2;
  auVar105._12_4_ = uVar2;
  auVar38 = pmulhrsw(auVar38,(undefined1  [16])input[0x16]);
  auVar106 = pmulhrsw(auVar105,(undefined1  [16])input[0x16]);
  auVar39 = pshuflw(ZEXT416(0x4c40),ZEXT416(0x4c40),0);
  uVar2 = auVar39._0_4_;
  auVar39._4_4_ = uVar2;
  auVar39._0_4_ = uVar2;
  auVar39._8_4_ = uVar2;
  auVar39._12_4_ = uVar2;
  auVar40 = pshuflw(ZEXT416(0x66d0),ZEXT416(0x66d0),0);
  uVar2 = auVar40._0_4_;
  auVar16._4_4_ = uVar2;
  auVar16._0_4_ = uVar2;
  auVar16._8_4_ = uVar2;
  auVar16._12_4_ = uVar2;
  auVar39 = pmulhrsw(auVar39,(undefined1  [16])input[0x1a]);
  auVar40 = pmulhrsw(auVar16,(undefined1  [16])input[0x1a]);
  auVar41 = pshuflw(ZEXT416(0xffffed38),ZEXT416(0xffffed38),0);
  uVar2 = auVar41._0_4_;
  auVar97._4_4_ = uVar2;
  auVar97._0_4_ = uVar2;
  auVar97._8_4_ = uVar2;
  auVar97._12_4_ = uVar2;
  auVar41 = pshuflw(ZEXT416(0x7ea0),ZEXT416(0x7ea0),0);
  auVar55._0_4_ = auVar41._0_4_;
  auVar55._4_4_ = auVar55._0_4_;
  auVar55._8_4_ = auVar55._0_4_;
  auVar55._12_4_ = auVar55._0_4_;
  auVar98 = pmulhrsw(auVar97,(undefined1  [16])input[6]);
  auVar41 = pmulhrsw(auVar55,(undefined1  [16])input[6]);
  local_238 = paddsw(auVar100,auVar96);
  local_228 = psubsw(auVar100,auVar96);
  local_218 = psubsw(auVar77,auVar89);
  local_208 = paddsw(auVar77,auVar89);
  local_1f8 = paddsw(auVar64,auVar54);
  local_1e8 = psubsw(auVar64,auVar54);
  local_1d8 = psubsw(auVar28,auVar26);
  local_1c8 = paddsw(auVar28,auVar26);
  local_1b8 = paddsw(auVar114,auVar30);
  local_1a8 = psubsw(auVar114,auVar30);
  local_198 = psubsw(auVar104,auVar32);
  local_188 = paddsw(auVar104,auVar32);
  local_178 = paddsw(auVar102,auVar9);
  local_168 = psubsw(auVar102,auVar9);
  local_158 = psubsw(auVar66,auVar10);
  local_148 = paddsw(auVar66,auVar10);
  local_138 = paddsw(auVar79,auVar34);
  local_128 = psubsw(auVar79,auVar34);
  local_118 = psubsw(auVar8,auVar91);
  local_108 = paddsw(auVar91,auVar8);
  local_f8 = paddsw(auVar110,auVar7);
  local_e8 = psubsw(auVar110,auVar7);
  local_d8 = psubsw(auVar5,auVar6);
  local_c8 = paddsw(auVar6,auVar5);
  local_b8 = paddsw(auVar4,auVar3);
  local_a8 = psubsw(auVar4,auVar3);
  local_98 = psubsw(auVar52,auVar24);
  local_88 = paddsw(auVar24,auVar52);
  local_78 = paddsw(auVar62,auVar75);
  local_68 = psubsw(auVar62,auVar75);
  local_58 = psubsw(auVar94,auVar87);
  local_48 = paddsw(auVar87,auVar94);
  auVar3 = pshuflw(ZEXT416(0xc88),ZEXT416(0xc88),0);
  uVar2 = auVar3._0_4_;
  auVar80._4_4_ = uVar2;
  auVar80._0_4_ = uVar2;
  auVar80._8_4_ = uVar2;
  auVar80._12_4_ = uVar2;
  local_3b8 = pmulhrsw(auVar80,(undefined1  [16])input[4]);
  auVar3 = pshuflw(ZEXT416(0x7f60),ZEXT416(0x7f60),0);
  auVar81._0_4_ = auVar3._0_4_;
  auVar81._4_4_ = auVar81._0_4_;
  auVar81._8_4_ = auVar81._0_4_;
  auVar81._12_4_ = auVar81._0_4_;
  local_348 = pmulhrsw(auVar81,(undefined1  [16])input[4]);
  auVar3 = pshuflw(ZEXT416(0xffffaed0),ZEXT416(0xffffaed0),0);
  auVar82._0_4_ = auVar3._0_4_;
  auVar82._4_4_ = auVar82._0_4_;
  auVar82._8_4_ = auVar82._0_4_;
  auVar82._12_4_ = auVar82._0_4_;
  local_3a8 = pmulhrsw(auVar82,(undefined1  [16])input[0x1c]);
  auVar3 = pshuflw(ZEXT416(0x62f0),ZEXT416(0x62f0),0);
  auVar83._0_4_ = auVar3._0_4_;
  auVar83._4_4_ = auVar83._0_4_;
  auVar83._8_4_ = auVar83._0_4_;
  auVar83._12_4_ = auVar83._0_4_;
  local_358 = pmulhrsw(auVar83,(undefined1  [16])input[0x1c]);
  auVar3 = pshuflw(ZEXT416(0x3c58),ZEXT416(0x3c58),0);
  auVar67._0_4_ = auVar3._0_4_;
  auVar67._4_4_ = auVar67._0_4_;
  auVar67._8_4_ = auVar67._0_4_;
  auVar67._12_4_ = auVar67._0_4_;
  local_398 = pmulhrsw(auVar67,(undefined1  [16])input[0x14]);
  auVar3 = pshuflw(ZEXT416(0x70e0),ZEXT416(0x70e0),0);
  auVar68._0_4_ = auVar3._0_4_;
  auVar68._4_4_ = auVar68._0_4_;
  auVar68._8_4_ = auVar68._0_4_;
  auVar68._12_4_ = auVar68._0_4_;
  local_368 = pmulhrsw(auVar68,(undefined1  [16])input[0x14]);
  auVar3 = pshuflw(ZEXT416(0xffffdad8),ZEXT416(0xffffdad8),0);
  auVar52._0_4_ = auVar3._0_4_;
  auVar52._4_4_ = auVar52._0_4_;
  auVar52._8_4_ = auVar52._0_4_;
  auVar52._12_4_ = auVar52._0_4_;
  local_388 = pmulhrsw(auVar52,(undefined1  [16])input[0xc]);
  auVar3 = pshuflw(ZEXT416(0x7a80),ZEXT416(0x7a80),0);
  auVar54._0_4_ = auVar3._0_4_;
  auVar54._4_4_ = auVar54._0_4_;
  auVar54._8_4_ = auVar54._0_4_;
  auVar54._12_4_ = auVar54._0_4_;
  local_378 = pmulhrsw(auVar54,(undefined1  [16])input[0xc]);
  local_338 = paddsw(auVar11,auVar13);
  local_328 = psubsw(auVar11,auVar13);
  local_318 = psubsw(auVar112,auVar15);
  local_308 = paddsw(auVar112,auVar15);
  local_2f8 = paddsw(auVar108,auVar38);
  local_2e8 = psubsw(auVar108,auVar38);
  local_2d8 = psubsw(auVar98,auVar39);
  local_2c8 = paddsw(auVar98,auVar39);
  local_2b8 = paddsw(auVar41,auVar40);
  local_2a8 = psubsw(auVar41,auVar40);
  local_298 = psubsw(auVar37,auVar106);
  local_288 = paddsw(auVar106,auVar37);
  local_278 = paddsw(auVar116,auVar36);
  local_268 = psubsw(auVar116,auVar36);
  local_258 = psubsw(auVar92,auVar35);
  local_248 = paddsw(auVar35,auVar92);
  alVar71[1]._0_4_ = 0xf4b0;
  alVar71[0] = 0xec8061f;
  alVar71[1]._4_4_ = 0;
  lVar1 = 0xf4b0;
  cospi = output;
  idct64_stage4_high32_sse2(&local_438,(int32_t *)output,alVar71,in_R8B);
  auVar92 = pshuflw(ZEXT416(0x18f8),ZEXT416(0x18f8),0);
  uVar2 = auVar92._0_4_;
  auVar62._4_4_ = uVar2;
  auVar62._0_4_ = uVar2;
  auVar62._8_4_ = uVar2;
  auVar62._12_4_ = uVar2;
  auVar92 = pshuflw(ZEXT416(0x7d88),ZEXT416(0x7d88),0);
  uVar2 = auVar92._0_4_;
  auVar42._4_4_ = uVar2;
  auVar42._0_4_ = uVar2;
  auVar42._8_4_ = uVar2;
  auVar42._12_4_ = uVar2;
  auVar92 = pmulhrsw(auVar62,(undefined1  [16])local_3f8);
  local_3c8 = pmulhrsw(auVar42,(undefined1  [16])local_3f8);
  auVar35 = pshuflw(ZEXT416(0xffffb8e0),ZEXT416(0xffffb8e0),0);
  auVar64._0_4_ = auVar35._0_4_;
  auVar64._4_4_ = auVar64._0_4_;
  auVar64._8_4_ = auVar64._0_4_;
  auVar64._12_4_ = auVar64._0_4_;
  auVar35 = pshuflw(ZEXT416(0x6a70),ZEXT416(0x6a70),0);
  auVar43._0_4_ = auVar35._0_4_;
  auVar43._4_4_ = auVar43._0_4_;
  auVar43._8_4_ = auVar43._0_4_;
  auVar43._12_4_ = auVar43._0_4_;
  local_3e8 = pmulhrsw(auVar64,(undefined1  [16])_local_3d8);
  _local_3d8 = (__m128i)pmulhrsw(auVar43,(undefined1  [16])_local_3d8);
  auVar35 = paddsw(local_3b8,local_3a8);
  local_3a8 = psubsw(local_3b8,local_3a8);
  auVar36 = psubsw(local_388,local_398);
  local_388 = paddsw(local_388,local_398);
  auVar37 = paddsw(local_378,local_368);
  local_368 = psubsw(local_378,local_368);
  auVar38 = psubsw(local_348,local_358);
  local_348 = paddsw(local_348,local_358);
  __rounding[1] = lVar1;
  __rounding[0] = extraout_RDX;
  local_3f8 = (__m128i)auVar92;
  local_3b8 = auVar35;
  local_398 = auVar36;
  local_378 = auVar37;
  local_358 = auVar38;
  idct64_stage5_high48_sse2(&local_438,(int32_t *)cospi,__rounding,in_R8B);
  auVar92 = pshuflw(ZEXT416(0x5a80),ZEXT416(0x5a80),0);
  auVar3._0_4_ = auVar92._0_4_;
  auVar3._4_4_ = auVar3._0_4_;
  auVar3._8_4_ = auVar3._0_4_;
  auVar3._12_4_ = auVar3._0_4_;
  local_438 = (__m128i)pmulhrsw(auVar3,(undefined1  [16])local_438);
  auVar92 = pshuflw(ZEXT416(0x30f8),ZEXT416(0x30f8),0);
  auVar4._0_4_ = auVar92._0_4_;
  auVar4._4_4_ = auVar4._0_4_;
  auVar4._8_4_ = auVar4._0_4_;
  auVar4._12_4_ = auVar4._0_4_;
  auVar92 = pshuflw(ZEXT416(0x7640),ZEXT416(0x7640),0);
  auVar75._0_4_ = auVar92._0_4_;
  auVar75._4_4_ = auVar75._0_4_;
  auVar75._8_4_ = auVar75._0_4_;
  auVar75._12_4_ = auVar75._0_4_;
  auVar92 = pmulhrsw(auVar4,(undefined1  [16])local_418);
  local_408 = pmulhrsw(auVar75,(undefined1  [16])local_418);
  auVar35 = paddsw((undefined1  [16])local_3f8,local_3e8);
  local_3e8 = psubsw((undefined1  [16])local_3f8,local_3e8);
  auVar36 = psubsw(local_3c8,(undefined1  [16])_local_3d8);
  local_3c8 = paddsw(local_3c8,(undefined1  [16])_local_3d8);
  auVar94._0_12_ = local_3a8._0_12_;
  auVar94._12_2_ = local_3a8._6_2_;
  auVar94._14_2_ = local_358._6_2_;
  auVar89._12_4_ = auVar94._12_4_;
  auVar89._0_10_ = local_3a8._0_10_;
  auVar89._10_2_ = local_358._4_2_;
  auVar87._10_6_ = auVar89._10_6_;
  auVar87._0_8_ = local_3a8._0_8_;
  auVar87._8_2_ = local_3a8._4_2_;
  auVar77._8_8_ = auVar87._8_8_;
  auVar77._6_2_ = local_358._2_2_;
  auVar77._4_2_ = local_3a8._2_2_;
  auVar77._0_2_ = local_3a8._0_2_;
  auVar77._2_2_ = local_358._0_2_;
  auVar44._2_2_ = local_358._8_2_;
  auVar44._0_2_ = local_3a8._8_2_;
  auVar44._4_2_ = local_3a8._10_2_;
  auVar44._6_2_ = local_358._10_2_;
  auVar44._8_2_ = local_3a8._12_2_;
  auVar44._10_2_ = local_358._12_2_;
  auVar44._12_2_ = local_3a8._14_2_;
  auVar44._14_2_ = local_358._14_2_;
  auVar5._8_4_ = 0x61ff138;
  auVar5._0_8_ = 0x61ff138061ff138;
  auVar5._12_4_ = 0x61ff138;
  auVar39 = pmaddwd(auVar77,auVar5);
  auVar3 = pmaddwd(auVar44,auVar5);
  auVar84._8_4_ = 0xec8061f;
  auVar84._0_8_ = 0xec8061f0ec8061f;
  auVar84._12_4_ = 0xec8061f;
  auVar37 = pmaddwd(auVar77,auVar84);
  auVar38 = pmaddwd(auVar44,auVar84);
  auVar56._0_4_ = auVar39._0_4_ + 0x800 >> 0xc;
  auVar56._4_4_ = auVar39._4_4_ + 0x800 >> 0xc;
  auVar56._8_4_ = auVar39._8_4_ + 0x800 >> 0xc;
  auVar56._12_4_ = auVar39._12_4_ + 0x800 >> 0xc;
  auVar69._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar69._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar69._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar69._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  local_3a8 = packssdw(auVar56,auVar69);
  auVar96._0_4_ = auVar37._0_4_ + 0x800 >> 0xc;
  auVar96._4_4_ = auVar37._4_4_ + 0x800 >> 0xc;
  auVar96._8_4_ = auVar37._8_4_ + 0x800 >> 0xc;
  auVar96._12_4_ = auVar37._12_4_ + 0x800 >> 0xc;
  auVar45._0_4_ = auVar38._0_4_ + 0x800 >> 0xc;
  auVar45._4_4_ = auVar38._4_4_ + 0x800 >> 0xc;
  auVar45._8_4_ = auVar38._8_4_ + 0x800 >> 0xc;
  auVar45._12_4_ = auVar38._12_4_ + 0x800 >> 0xc;
  local_358 = packssdw(auVar96,auVar45);
  auVar100._0_12_ = local_398._0_12_;
  auVar100._12_2_ = local_398._6_2_;
  auVar100._14_2_ = local_368._6_2_;
  auVar110._12_4_ = auVar100._12_4_;
  auVar110._0_10_ = local_398._0_10_;
  auVar110._10_2_ = local_368._4_2_;
  auVar102._10_6_ = auVar110._10_6_;
  auVar102._0_8_ = local_398._0_8_;
  auVar102._8_2_ = local_398._4_2_;
  auVar104._8_8_ = auVar102._8_8_;
  auVar104._6_2_ = local_368._2_2_;
  auVar104._4_2_ = local_398._2_2_;
  auVar104._0_2_ = local_398._0_2_;
  auVar104._2_2_ = local_368._0_2_;
  auVar46._2_2_ = local_368._8_2_;
  auVar46._0_2_ = local_398._8_2_;
  auVar46._4_2_ = local_398._10_2_;
  auVar46._6_2_ = local_368._10_2_;
  auVar46._8_2_ = local_398._12_2_;
  auVar46._10_2_ = local_368._12_2_;
  auVar46._12_2_ = local_398._14_2_;
  auVar46._14_2_ = local_368._14_2_;
  auVar57._8_4_ = 0xf138f9e1;
  auVar57._0_8_ = 0xf138f9e1f138f9e1;
  auVar57._12_4_ = 0xf138f9e1;
  auVar3 = pmaddwd(auVar104,auVar57);
  auVar39 = pmaddwd(auVar57,auVar46);
  auVar37 = pmaddwd(auVar104,auVar5);
  auVar38 = pmaddwd(auVar46,auVar5);
  auVar70._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar70._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar70._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar70._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar58._0_4_ = auVar39._0_4_ + 0x800 >> 0xc;
  auVar58._4_4_ = auVar39._4_4_ + 0x800 >> 0xc;
  auVar58._8_4_ = auVar39._8_4_ + 0x800 >> 0xc;
  auVar58._12_4_ = auVar39._12_4_ + 0x800 >> 0xc;
  local_398 = packssdw(auVar70,auVar58);
  auVar114._0_4_ = auVar37._0_4_ + 0x800 >> 0xc;
  auVar114._4_4_ = auVar37._4_4_ + 0x800 >> 0xc;
  auVar114._8_4_ = auVar37._8_4_ + 0x800 >> 0xc;
  auVar114._12_4_ = auVar37._12_4_ + 0x800 >> 0xc;
  auVar47._0_4_ = auVar38._0_4_ + 0x800 >> 0xc;
  auVar47._4_4_ = auVar38._4_4_ + 0x800 >> 0xc;
  auVar47._8_4_ = auVar38._8_4_ + 0x800 >> 0xc;
  auVar47._12_4_ = auVar38._12_4_ + 0x800 >> 0xc;
  local_368 = packssdw(auVar114,auVar47);
  __rounding_00[1] = lVar1;
  __rounding_00[0] = extraout_RDX_00;
  local_428 = local_438;
  local_418 = (__m128i)auVar92;
  local_3f8 = (__m128i)auVar35;
  _local_3d8 = (__m128i)auVar36;
  idct64_stage6_high48_sse2(&local_438,(int32_t *)cospi,__rounding_00,in_R8B);
  alVar71 = (__m128i)paddsw((undefined1  [16])local_438,local_408);
  local_408 = psubsw((undefined1  [16])local_438,local_408);
  auVar92 = paddsw((undefined1  [16])local_428,(undefined1  [16])local_418);
  local_418 = (__m128i)psubsw((undefined1  [16])local_428,(undefined1  [16])local_418);
  auVar9._0_12_ = local_3e8._0_12_;
  auVar9._12_2_ = local_3e8._6_2_;
  auVar9._14_2_ = uStack_3d2;
  auVar8._12_4_ = auVar9._12_4_;
  auVar8._0_10_ = local_3e8._0_10_;
  auVar8._10_2_ = uStack_3d4;
  auVar7._10_6_ = auVar8._10_6_;
  auVar7._0_8_ = local_3e8._0_8_;
  auVar7._8_2_ = local_3e8._4_2_;
  auVar6._8_8_ = auVar7._8_8_;
  auVar6._6_2_ = local_3d8._2_2_;
  auVar6._4_2_ = local_3e8._2_2_;
  auVar6._0_2_ = local_3e8._0_2_;
  auVar6._2_2_ = local_3d8._0_2_;
  auVar17._2_2_ = uStack_3d0;
  auVar17._0_2_ = local_3e8._8_2_;
  auVar17._4_2_ = local_3e8._10_2_;
  auVar17._6_2_ = uStack_3ce;
  auVar17._8_2_ = local_3e8._12_2_;
  auVar17._10_2_ = uStack_3cc;
  auVar17._12_2_ = local_3e8._14_2_;
  auVar17._14_2_ = uStack_3ca;
  auVar72._8_4_ = 0xb50f4b0;
  auVar72._0_8_ = 0xb50f4b00b50f4b0;
  auVar72._12_4_ = 0xb50f4b0;
  auVar37 = pmaddwd(auVar6,auVar72);
  auVar38 = pmaddwd(auVar17,auVar72);
  auVar73._8_4_ = 0xb500b50;
  auVar73._0_8_ = 0xb500b500b500b50;
  auVar73._12_4_ = 0xb500b50;
  auVar35 = pmaddwd(auVar6,auVar73);
  auVar36 = pmaddwd(auVar17,auVar73);
  auVar48._0_4_ = auVar37._0_4_ + 0x800 >> 0xc;
  auVar48._4_4_ = auVar37._4_4_ + 0x800 >> 0xc;
  auVar48._8_4_ = auVar37._8_4_ + 0x800 >> 0xc;
  auVar48._12_4_ = auVar37._12_4_ + 0x800 >> 0xc;
  auVar59._0_4_ = auVar38._0_4_ + 0x800 >> 0xc;
  auVar59._4_4_ = auVar38._4_4_ + 0x800 >> 0xc;
  auVar59._8_4_ = auVar38._8_4_ + 0x800 >> 0xc;
  auVar59._12_4_ = auVar38._12_4_ + 0x800 >> 0xc;
  local_3e8 = packssdw(auVar48,auVar59);
  auVar10._0_4_ = auVar35._0_4_ + 0x800 >> 0xc;
  auVar10._4_4_ = auVar35._4_4_ + 0x800 >> 0xc;
  auVar10._8_4_ = auVar35._8_4_ + 0x800 >> 0xc;
  auVar10._12_4_ = auVar35._12_4_ + 0x800 >> 0xc;
  auVar18._0_4_ = auVar36._0_4_ + 0x800 >> 0xc;
  auVar18._4_4_ = auVar36._4_4_ + 0x800 >> 0xc;
  auVar18._8_4_ = auVar36._8_4_ + 0x800 >> 0xc;
  auVar18._12_4_ = auVar36._12_4_ + 0x800 >> 0xc;
  _local_3d8 = (__m128i)packssdw(auVar10,auVar18);
  auVar35 = paddsw(local_3b8,local_388);
  local_388 = psubsw(local_3b8,local_388);
  auVar36 = paddsw(local_3a8,local_398);
  local_398 = psubsw(local_3a8,local_398);
  auVar37 = psubsw(local_348,local_378);
  local_348 = paddsw(local_348,local_378);
  auVar38 = psubsw(local_358,local_368);
  local_358 = paddsw(local_358,local_368);
  __rounding_01[1] = lVar1;
  __rounding_01[0] = extraout_RDX_01;
  local_438 = alVar71;
  local_428 = (__m128i)auVar92;
  local_3b8 = auVar35;
  local_3a8 = auVar36;
  local_378 = auVar37;
  local_368 = auVar38;
  idct64_stage7_high48_sse2(&local_438,(int32_t *)cospi,__rounding_01,in_R8B);
  alVar71 = (__m128i)paddsw((undefined1  [16])local_438,local_3c8);
  local_3c8 = psubsw((undefined1  [16])local_438,local_3c8);
  auVar35 = paddsw((undefined1  [16])local_428,(undefined1  [16])_local_3d8);
  _local_3d8 = (__m128i)psubsw((undefined1  [16])local_428,(undefined1  [16])_local_3d8);
  auVar36 = paddsw((undefined1  [16])local_418,local_3e8);
  local_3e8 = psubsw((undefined1  [16])local_418,local_3e8);
  auVar37 = paddsw(local_408,(undefined1  [16])local_3f8);
  local_3f8 = (__m128i)psubsw(local_408,(undefined1  [16])local_3f8);
  auVar11._0_12_ = local_398._0_12_;
  auVar11._12_2_ = local_398._6_2_;
  auVar11._14_2_ = local_368._6_2_;
  auVar40._12_4_ = auVar11._12_4_;
  auVar40._0_10_ = local_398._0_10_;
  auVar40._10_2_ = local_368._4_2_;
  auVar13._10_6_ = auVar40._10_6_;
  auVar13._0_8_ = local_398._0_8_;
  auVar13._8_2_ = local_398._4_2_;
  auVar15._8_8_ = auVar13._8_8_;
  auVar15._6_2_ = local_368._2_2_;
  auVar15._4_2_ = local_398._2_2_;
  auVar15._0_2_ = local_398._0_2_;
  auVar15._2_2_ = local_368._0_2_;
  auVar19._2_2_ = local_368._8_2_;
  auVar19._0_2_ = local_398._8_2_;
  auVar19._4_2_ = local_398._10_2_;
  auVar19._6_2_ = local_368._10_2_;
  auVar19._8_2_ = local_398._12_2_;
  auVar19._10_2_ = local_368._12_2_;
  auVar19._12_2_ = local_398._14_2_;
  auVar19._14_2_ = local_368._14_2_;
  auVar39 = pmaddwd(auVar15,auVar72);
  auVar3 = pmaddwd(auVar19,auVar72);
  auVar92 = pmaddwd(auVar15,auVar73);
  auVar38 = pmaddwd(auVar19,auVar73);
  auVar49._0_4_ = auVar39._0_4_ + 0x800 >> 0xc;
  auVar49._4_4_ = auVar39._4_4_ + 0x800 >> 0xc;
  auVar49._8_4_ = auVar39._8_4_ + 0x800 >> 0xc;
  auVar49._12_4_ = auVar39._12_4_ + 0x800 >> 0xc;
  auVar60._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar60._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar60._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar60._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  local_398 = packssdw(auVar49,auVar60);
  auVar24._0_4_ = auVar92._0_4_ + 0x800 >> 0xc;
  auVar24._4_4_ = auVar92._4_4_ + 0x800 >> 0xc;
  auVar24._8_4_ = auVar92._8_4_ + 0x800 >> 0xc;
  auVar24._12_4_ = auVar92._12_4_ + 0x800 >> 0xc;
  auVar20._0_4_ = auVar38._0_4_ + 0x800 >> 0xc;
  auVar20._4_4_ = auVar38._4_4_ + 0x800 >> 0xc;
  auVar20._8_4_ = auVar38._8_4_ + 0x800 >> 0xc;
  auVar20._12_4_ = auVar38._12_4_ + 0x800 >> 0xc;
  local_368 = packssdw(auVar24,auVar20);
  auVar30._0_12_ = local_388._0_12_;
  auVar30._12_2_ = local_388._6_2_;
  auVar30._14_2_ = local_378._6_2_;
  auVar28._12_4_ = auVar30._12_4_;
  auVar28._0_10_ = local_388._0_10_;
  auVar28._10_2_ = local_378._4_2_;
  auVar26._10_6_ = auVar28._10_6_;
  auVar26._0_8_ = local_388._0_8_;
  auVar26._8_2_ = local_388._4_2_;
  auVar32._8_8_ = auVar26._8_8_;
  auVar32._6_2_ = local_378._2_2_;
  auVar32._4_2_ = local_388._2_2_;
  auVar32._0_2_ = local_388._0_2_;
  auVar32._2_2_ = local_378._0_2_;
  auVar21._2_2_ = local_378._8_2_;
  auVar21._0_2_ = local_388._8_2_;
  auVar21._4_2_ = local_388._10_2_;
  auVar21._6_2_ = local_378._10_2_;
  auVar21._8_2_ = local_388._12_2_;
  auVar21._10_2_ = local_378._12_2_;
  auVar21._12_2_ = local_388._14_2_;
  auVar21._14_2_ = local_378._14_2_;
  auVar39 = pmaddwd(auVar32,auVar72);
  auVar3 = pmaddwd(auVar72,auVar21);
  auVar92 = pmaddwd(auVar32,auVar73);
  auVar38 = pmaddwd(auVar21,auVar73);
  auVar50._0_4_ = auVar39._0_4_ + 0x800 >> 0xc;
  auVar50._4_4_ = auVar39._4_4_ + 0x800 >> 0xc;
  auVar50._8_4_ = auVar39._8_4_ + 0x800 >> 0xc;
  auVar50._12_4_ = auVar39._12_4_ + 0x800 >> 0xc;
  auVar85._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar85._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar85._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar85._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  local_388 = packssdw(auVar50,auVar85);
  auVar34._0_4_ = auVar92._0_4_ + 0x800 >> 0xc;
  auVar34._4_4_ = auVar92._4_4_ + 0x800 >> 0xc;
  auVar34._8_4_ = auVar92._8_4_ + 0x800 >> 0xc;
  auVar34._12_4_ = auVar92._12_4_ + 0x800 >> 0xc;
  auVar22._0_4_ = auVar38._0_4_ + 0x800 >> 0xc;
  auVar22._4_4_ = auVar38._4_4_ + 0x800 >> 0xc;
  auVar22._8_4_ = auVar38._8_4_ + 0x800 >> 0xc;
  auVar22._12_4_ = auVar38._12_4_ + 0x800 >> 0xc;
  local_378 = packssdw(auVar34,auVar22);
  __rounding_02[1] = lVar1;
  __rounding_02[0] = extraout_RDX_02;
  local_438 = alVar71;
  local_428 = (__m128i)auVar35;
  local_418 = (__m128i)auVar36;
  local_408 = auVar37;
  idct64_stage8_high48_sse2(&local_438,(int32_t *)cospi,__rounding_02,in_R8B);
  __rounding_03[1] = lVar1;
  __rounding_03[0] = extraout_RDX_03;
  idct64_stage9_sse2(&local_438,(int32_t *)cospi,__rounding_03,in_R8B);
  __rounding_04[1] = lVar1;
  __rounding_04[0] = extraout_RDX_04;
  idct64_stage10_sse2(&local_438,(int32_t *)cospi,__rounding_04,in_R8B);
  idct64_stage11_sse2(output,&local_438);
  return;
}

Assistant:

static void idct64_low32_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m128i x[64];
  x[0] = input[0];
  x[2] = input[16];
  x[4] = input[8];
  x[6] = input[24];
  x[8] = input[4];
  x[10] = input[20];
  x[12] = input[12];
  x[14] = input[28];
  x[16] = input[2];
  x[18] = input[18];
  x[20] = input[10];
  x[22] = input[26];
  x[24] = input[6];
  x[26] = input[22];
  x[28] = input[14];
  x[30] = input[30];
  x[32] = input[1];
  x[34] = input[17];
  x[36] = input[9];
  x[38] = input[25];
  x[40] = input[5];
  x[42] = input[21];
  x[44] = input[13];
  x[46] = input[29];
  x[48] = input[3];
  x[50] = input[19];
  x[52] = input[11];
  x[54] = input[27];
  x[56] = input[7];
  x[58] = input[23];
  x[60] = input[15];
  x[62] = input[31];

  // stage 2
  btf_16_ssse3(cospi[63], cospi[1], x[32], x[32], x[63]);
  btf_16_ssse3(-cospi[33], cospi[31], x[62], x[33], x[62]);
  btf_16_ssse3(cospi[47], cospi[17], x[34], x[34], x[61]);
  btf_16_ssse3(-cospi[49], cospi[15], x[60], x[35], x[60]);
  btf_16_ssse3(cospi[55], cospi[9], x[36], x[36], x[59]);
  btf_16_ssse3(-cospi[41], cospi[23], x[58], x[37], x[58]);
  btf_16_ssse3(cospi[39], cospi[25], x[38], x[38], x[57]);
  btf_16_ssse3(-cospi[57], cospi[7], x[56], x[39], x[56]);
  btf_16_ssse3(cospi[59], cospi[5], x[40], x[40], x[55]);
  btf_16_ssse3(-cospi[37], cospi[27], x[54], x[41], x[54]);
  btf_16_ssse3(cospi[43], cospi[21], x[42], x[42], x[53]);
  btf_16_ssse3(-cospi[53], cospi[11], x[52], x[43], x[52]);
  btf_16_ssse3(cospi[51], cospi[13], x[44], x[44], x[51]);
  btf_16_ssse3(-cospi[45], cospi[19], x[50], x[45], x[50]);
  btf_16_ssse3(cospi[35], cospi[29], x[46], x[46], x[49]);
  btf_16_ssse3(-cospi[61], cospi[3], x[48], x[47], x[48]);

  // stage 3
  btf_16_ssse3(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_ssse3(-cospi[34], cospi[30], x[30], x[17], x[30]);
  btf_16_ssse3(cospi[46], cospi[18], x[18], x[18], x[29]);
  btf_16_ssse3(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_ssse3(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_ssse3(-cospi[42], cospi[22], x[26], x[21], x[26]);
  btf_16_ssse3(cospi[38], cospi[26], x[22], x[22], x[25]);
  btf_16_ssse3(-cospi[58], cospi[6], x[24], x[23], x[24]);
  btf_16_adds_subs_sse2(x[32], x[33]);
  btf_16_subs_adds_sse2(x[35], x[34]);
  btf_16_adds_subs_sse2(x[36], x[37]);
  btf_16_subs_adds_sse2(x[39], x[38]);
  btf_16_adds_subs_sse2(x[40], x[41]);
  btf_16_subs_adds_sse2(x[43], x[42]);
  btf_16_adds_subs_sse2(x[44], x[45]);
  btf_16_subs_adds_sse2(x[47], x[46]);
  btf_16_adds_subs_sse2(x[48], x[49]);
  btf_16_subs_adds_sse2(x[51], x[50]);
  btf_16_adds_subs_sse2(x[52], x[53]);
  btf_16_subs_adds_sse2(x[55], x[54]);
  btf_16_adds_subs_sse2(x[56], x[57]);
  btf_16_subs_adds_sse2(x[59], x[58]);
  btf_16_adds_subs_sse2(x[60], x[61]);
  btf_16_subs_adds_sse2(x[63], x[62]);

  // stage 4
  btf_16_ssse3(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_ssse3(-cospi[36], cospi[28], x[14], x[9], x[14]);
  btf_16_ssse3(cospi[44], cospi[20], x[10], x[10], x[13]);
  btf_16_ssse3(-cospi[52], cospi[12], x[12], x[11], x[12]);
  btf_16_adds_subs_sse2(x[16], x[17]);
  btf_16_subs_adds_sse2(x[19], x[18]);
  btf_16_adds_subs_sse2(x[20], x[21]);
  btf_16_subs_adds_sse2(x[23], x[22]);
  btf_16_adds_subs_sse2(x[24], x[25]);
  btf_16_subs_adds_sse2(x[27], x[26]);
  btf_16_adds_subs_sse2(x[28], x[29]);
  btf_16_subs_adds_sse2(x[31], x[30]);
  idct64_stage4_high32_sse2(x, cospi, __rounding, cos_bit);

  // stage 5
  btf_16_ssse3(cospi[56], cospi[8], x[4], x[4], x[7]);
  btf_16_ssse3(-cospi[40], cospi[24], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[9]);
  btf_16_subs_adds_sse2(x[11], x[10]);
  btf_16_adds_subs_sse2(x[12], x[13]);
  btf_16_subs_adds_sse2(x[15], x[14]);
  idct64_stage5_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 6
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);
  btf_16_ssse3(cospi[48], cospi[16], x[2], x[2], x[3]);
  btf_16_adds_subs_sse2(x[4], x[5]);
  btf_16_subs_adds_sse2(x[7], x[6]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[9], x[14], x[9], x[14]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[10], x[13], x[10], x[13]);
  idct64_stage6_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 7
  btf_16_adds_subs_sse2(x[0], x[3]);
  btf_16_adds_subs_sse2(x[1], x[2]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[11]);
  btf_16_adds_subs_sse2(x[9], x[10]);
  btf_16_subs_adds_sse2(x[15], x[12]);
  btf_16_subs_adds_sse2(x[14], x[13]);
  idct64_stage7_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 8
  btf_16_adds_subs_sse2(x[0], x[7]);
  btf_16_adds_subs_sse2(x[1], x[6]);
  btf_16_adds_subs_sse2(x[2], x[5]);
  btf_16_adds_subs_sse2(x[3], x[4]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[10], x[13], x[10], x[13]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[11], x[12], x[11], x[12]);
  idct64_stage8_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 9~11
  idct64_stage9_sse2(x, cospi, __rounding, cos_bit);
  idct64_stage10_sse2(x, cospi, __rounding, cos_bit);
  idct64_stage11_sse2(output, x);
}